

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O0

void DrawEllipse(int centerX,int centerY,float radiusH,float radiusV,Color color)

{
  float fVar1;
  float fVar2;
  undefined4 local_20;
  int i;
  float radiusV_local;
  float radiusH_local;
  int centerY_local;
  int centerX_local;
  Color color_local;
  
  rlCheckRenderBatchLimit(0x6c);
  rlBegin(4);
  for (local_20 = 0; local_20 < 0x168; local_20 = local_20 + 10) {
    centerY_local._0_1_ = color.r;
    centerY_local._1_1_ = color.g;
    centerY_local._2_1_ = color.b;
    centerY_local._3_1_ = color.a;
    rlColor4ub((uchar)centerY_local,centerY_local._1_1_,centerY_local._2_1_,centerY_local._3_1_);
    rlVertex2f((float)centerX,(float)centerY);
    fVar1 = sinf((float)local_20 * 0.017453292);
    fVar2 = cosf((float)local_20 * 0.017453292);
    rlVertex2f(fVar1 * radiusH + (float)centerX,fVar2 * radiusV + (float)centerY);
    fVar1 = sinf((float)(local_20 + 10) * 0.017453292);
    fVar2 = cosf((float)(local_20 + 10) * 0.017453292);
    rlVertex2f(fVar1 * radiusH + (float)centerX,fVar2 * radiusV + (float)centerY);
  }
  rlEnd();
  return;
}

Assistant:

void DrawEllipse(int centerX, int centerY, float radiusH, float radiusV, Color color)
{
    rlCheckRenderBatchLimit(3*36);

    rlBegin(RL_TRIANGLES);
        for (int i = 0; i < 360; i += 10)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f((float)centerX, (float)centerY);
            rlVertex2f((float)centerX + sinf(DEG2RAD*i)*radiusH, (float)centerY + cosf(DEG2RAD*i)*radiusV);
            rlVertex2f((float)centerX + sinf(DEG2RAD*(i + 10))*radiusH, (float)centerY + cosf(DEG2RAD*(i + 10))*radiusV);
        }
    rlEnd();
}